

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O1

iterator * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::end_related
          (iterator *__return_storage_ptr__,RelationsGraph<dg::vr::ValueRelations> *this,
          Bucket *start)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  _Base_ptr p_Var3;
  
  iVar2 = getItFor(this,start);
  p_Var3 = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
  p_Var1 = &(__return_storage_ptr__->visited)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->visited)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->visited)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->bucketIt)._M_node = p_Var3;
  (__return_storage_ptr__->endIt)._M_node = p_Var3;
  (__return_storage_ptr__->edgeIt).allowedEdges.bits.super__Base_bitset<1UL>._M_w = 0;
  (__return_storage_ptr__->edgeIt).undirectedOnly = false;
  (__return_storage_ptr__->edgeIt).relationsFocused = false;
  (__return_storage_ptr__->edgeIt).stack.
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->edgeIt).stack.
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->edgeIt).stack.
  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->edgeIt).visited._M_data = &__return_storage_ptr__->visited;
  return __return_storage_ptr__;
}

Assistant:

iterator end_related(const Bucket &start) const {
        auto endIt = ++getItFor(start);
        return iterator(endIt);
    }